

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack30_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar11 [32];
  
  auVar8 = *(undefined1 (*) [32])(in + 1);
  uVar1 = *in;
  auVar5 = *(undefined1 (*) [16])(in + 5);
  auVar4 = vpmovsxbd_avx(ZEXT416(0x18161412));
  auVar16._8_8_ = 0x1c0000001a;
  auVar16._0_8_ = 0x1c0000001a;
  auVar15._8_8_ = 0x300000003c000000;
  auVar15._0_8_ = 0x300000003c000000;
  *out = uVar1 & 0x3fffffff;
  uVar2 = *(ulong *)(in + 0xd);
  auVar7 = valignd_avx512vl(auVar8,auVar8,7);
  auVar9 = vpblendd_avx2(auVar7,ZEXT432(uVar1),1);
  auVar7 = vpmovsxbd_avx2(ZEXT816(0x100e0c0a08060402));
  auVar8 = vpshldvd_avx512_vbmi2(auVar8,auVar9,auVar7);
  auVar10._8_4_ = 0x3fffffff;
  auVar10._0_8_ = 0x3fffffff3fffffff;
  auVar10._12_4_ = 0x3fffffff;
  auVar11._16_4_ = 0x3fffffff;
  auVar11._0_16_ = auVar10;
  auVar11._20_4_ = 0x3fffffff;
  auVar11._24_4_ = 0x3fffffff;
  auVar11._28_4_ = 0x3fffffff;
  auVar8 = vpand_avx2(auVar8,auVar11);
  *(undefined1 (*) [32])(out + 1) = auVar8;
  auVar6 = *(undefined1 (*) [16])(in + 9);
  auVar5 = vpalignr_avx(auVar6,auVar5,0xc);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar2;
  auVar3 = vpalignr_avx(auVar13,auVar6,0xc);
  auVar13 = vpsllvd_avx2(auVar13,auVar16);
  auVar5 = vpshldvd_avx512_vbmi2(auVar6,auVar5,auVar4);
  auVar5 = vpand_avx(auVar5,auVar10);
  *(undefined1 (*) [16])(out + 9) = auVar5;
  auVar12._8_8_ = 0x400000006;
  auVar12._0_8_ = 0x400000006;
  auVar5 = vpsrlvd_avx2(auVar3,auVar12);
  auVar5 = vpternlogd_avx512vl(auVar13,auVar5,auVar15,0xec);
  auVar8 = *(undefined1 (*) [32])(in + 0x10);
  *(long *)(out + 0xd) = auVar5._0_8_;
  out[0xf] = (uint)(uVar2 >> 0x22);
  uVar1 = in[0xf];
  out[0x10] = uVar1 & 0x3fffffff;
  uVar2 = *(ulong *)(in + 0x1c);
  auVar9 = valignd_avx512vl(auVar8,auVar8,7);
  auVar9 = vpblendd_avx2(auVar9,ZEXT432(uVar1),1);
  auVar8 = vpshldvd_avx512_vbmi2(auVar8,auVar9,auVar7);
  auVar8 = vpand_avx2(auVar8,auVar11);
  auVar5 = *(undefined1 (*) [16])(in + 0x14);
  *(undefined1 (*) [32])(out + 0x11) = auVar8;
  auVar6 = *(undefined1 (*) [16])(in + 0x18);
  auVar5 = vpalignr_avx(auVar6,auVar5,0xc);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar2;
  auVar3 = vpalignr_avx(auVar14,auVar6,0xc);
  auVar5 = vpshldvd_avx512_vbmi2(auVar6,auVar5,auVar4);
  auVar3 = vpsrlvd_avx2(auVar3,auVar12);
  auVar5 = vpand_avx(auVar5,auVar10);
  auVar6 = vpsllvd_avx2(auVar14,auVar16);
  auVar6 = vpternlogd_avx512vl(auVar6,auVar3,auVar15,0xec);
  *(undefined1 (*) [16])(out + 0x19) = auVar5;
  *(long *)(out + 0x1d) = auVar6._0_8_;
  out[0x1f] = (uint)(uVar2 >> 0x22);
  return in + 0x1e;
}

Assistant:

const uint32_t *__fastunpack30_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 28)) << (30 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 26)) << (30 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 24)) << (30 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 22)) << (30 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 20)) << (30 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 18)) << (30 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 16)) << (30 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 14)) << (30 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 12)) << (30 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 10)) << (30 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 8)) << (30 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 6)) << (30 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 4)) << (30 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  *out |= ((*in) % (1U << 2)) << (30 - 2);
  out++;
  *out = ((*in) >> 2);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 28)) << (30 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 26)) << (30 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 24)) << (30 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 22)) << (30 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 20)) << (30 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 18)) << (30 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 16)) << (30 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 14)) << (30 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 12)) << (30 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 10)) << (30 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 8)) << (30 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 6)) << (30 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 4)) << (30 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  *out |= ((*in) % (1U << 2)) << (30 - 2);
  out++;
  *out = ((*in) >> 2);
  ++in;
  out++;

  return in;
}